

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O2

void mpp_timer_put(MppTimer timer)

{
  MppThread *this;
  MPP_RET MVar1;
  
  if (timer != (MppTimer)0x0) {
    MVar1 = check_is_mpp_timer(timer);
    if (MVar1 == MPP_OK) {
      if (*(int *)((long)timer + 0x18) != 0) {
        mpp_timer_set_enable(timer,0);
      }
      if (-1 < *(int *)((long)timer + 0x24)) {
        close(*(int *)((long)timer + 0x24));
        *(undefined4 *)((long)timer + 0x24) = 0xffffffff;
      }
      if (-1 < *(int *)((long)timer + 0x28)) {
        close(*(int *)((long)timer + 0x28));
        *(undefined4 *)((long)timer + 0x28) = 0xffffffff;
      }
      this = *(MppThread **)((long)timer + 0x30);
      if (this != (MppThread *)0x0) {
        MppThread::~MppThread(this);
        operator_delete(this,0x198);
        *(undefined8 *)((long)timer + 0x30) = 0;
      }
      mpp_osal_free("mpp_timer_put",timer);
      return;
    }
  }
  _mpp_log_l(2,"mpp_time","invalid timer %p\n","mpp_timer_put",timer);
  return;
}

Assistant:

void mpp_timer_put(MppTimer timer)
{
    if (NULL == timer || check_is_mpp_timer(timer)) {
        mpp_err_f("invalid timer %p\n", timer);
        return ;
    }

    MppTimerImpl *impl = (MppTimerImpl *)timer;

    if (impl->enabled)
        mpp_timer_set_enable(timer, 0);

    if (impl->timer_fd >= 0) {
        close(impl->timer_fd);
        impl->timer_fd = -1;
    }

    if (impl->epoll_fd >= 0) {
        close(impl->epoll_fd);
        impl->epoll_fd = -1;
    }

    if (impl->thd) {
        delete impl->thd;
        impl->thd = NULL;
    }

    if (impl) {
        mpp_free(impl);
        impl = NULL;
    }
}